

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

timer_element * remove_timer(timer_element **base,short func_index,void *arg)

{
  timer_element *ptVar1;
  timer_element *ptVar2;
  undefined2 in_register_00000032;
  timer_element *ptVar3;
  
  ptVar1 = (timer_element *)0x0;
  ptVar3 = (timer_element *)base;
  do {
    ptVar2 = ptVar1;
    ptVar3 = ptVar3->next;
    if (ptVar3 == (timer_element *)0x0) {
      return ptVar3;
    }
    ptVar1 = ptVar3;
  } while (((uint)ptVar3->func_index != CONCAT22(in_register_00000032,func_index)) ||
          (ptVar3->arg != arg));
  if (ptVar2 != (timer_element *)0x0) {
    base = &ptVar2->next;
  }
  ((timer_element *)base)->next = ptVar3->next;
  return ptVar3;
}

Assistant:

static timer_element *remove_timer(timer_element **base, short func_index,
				   void * arg)
{
    timer_element *prev, *curr;

    for (prev = 0, curr = *base; curr; prev = curr, curr = curr->next)
	if (curr->func_index == func_index && curr->arg == arg) break;

    if (curr) {
	if (prev)
	    prev->next = curr->next;
	else
	    *base = curr->next;
    }

    return curr;
}